

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void EraseNode(nodecontext *p,node *Node,nodeclass *Class)

{
  size_t sVar1;
  
  sVar1 = NodeSize(Class);
  Node->Magic = 0;
  UnlockModules(Class);
  if ((Class->Flags & 0x20) == 0) {
    (*p->NodeHeap->Free)(p->NodeHeap,Node,sVar1);
    return;
  }
  return;
}

Assistant:

static void EraseNode(nodecontext* p,node* Node,const nodeclass* Class)
{
    size_t Size = NodeSize(Class);

#ifdef CONFIG_DEBUGCHECKS
    Node->Magic = 0;
#endif

    UnlockModules(Class);

    if (!(Class->Flags & CFLAG_OWN_MEMORY))
        MemHeap_Free(p->NodeHeap,Node,Size);
}